

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::CheckInvariants(GraphCycles *this)

{
  uint uVar1;
  Rep *pRVar2;
  Node *pNVar3;
  Node *pNVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong unaff_RBP;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  NodeSet ranks;
  
  pRVar2 = this->rep_;
  anon_unknown_0::NodeSet::NodeSet(&ranks);
  if ((pRVar2->nodes_).size_ == 0) {
LAB_00394b8a:
    anon_unknown_0::Vec<int>::~Vec(&ranks.table_);
    return true;
  }
  uVar9 = 0;
LAB_00394a87:
  pNVar3 = (pRVar2->nodes_).ptr_[uVar9];
  if (pNVar3->masked_ptr != 0xf03a5f7bf03a5f7b) {
    uVar12 = pNVar3->masked_ptr ^ 0xf03a5f7bf03a5f7b;
    uVar6 = (pRVar2->ptrmap_).table_._M_elems
            [(uint)((int)uVar12 + (int)(uVar12 / 0x3fffb) * -0x3fffb)];
    while (uVar6 != 0xffffffff) {
      pNVar4 = ((pRVar2->ptrmap_).nodes_)->ptr_[uVar6];
      uVar10 = (ulong)uVar6;
      if ((pNVar4->masked_ptr ^ uVar12) == 0xf03a5f7bf03a5f7b) goto LAB_00394b04;
      uVar6 = pNVar4->next_hash;
    }
    uVar10 = 0xffffffff;
LAB_00394b04:
    if (uVar9 != uVar10) {
      raw_log_internal::RawLog
                (kFatal,"graphcycles.cc",400,"Did not find live node in hash table %u %p",
                 uVar9 & 0xffffffff);
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/synchronization/internal/graphcycles.cc"
                    ,400,"bool absl::synchronization_internal::GraphCycles::CheckInvariants() const"
                   );
    }
  }
  if (pNVar3->visited == true) {
    raw_log_internal::RawLog
              (kFatal,"graphcycles.cc",0x193,"Did not clear visited marker on node %u",
               uVar9 & 0xffffffff);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/synchronization/internal/graphcycles.cc"
                  ,0x193,"bool absl::synchronization_internal::GraphCycles::CheckInvariants() const"
                 );
  }
  bVar5 = anon_unknown_0::NodeSet::insert(&ranks,pNVar3->rank);
  if (!bVar5) {
    raw_log_internal::RawLog
              (kFatal,"graphcycles.cc",0x196,"Duplicate occurrence of rank %d",
               (ulong)(uint)pNVar3->rank);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/synchronization/internal/graphcycles.cc"
                  ,0x196,"bool absl::synchronization_internal::GraphCycles::CheckInvariants() const"
                 );
  }
  uVar6 = (pNVar3->out).table_.size_;
  uVar8 = 0;
  uVar12 = unaff_RBP & 0xffffffff;
  do {
    uVar11 = uVar6;
    if (uVar6 < uVar8) {
      uVar11 = uVar8;
    }
    do {
      uVar7 = uVar8;
      unaff_RBP = uVar12;
      uVar8 = uVar11;
      if (uVar11 == uVar7) break;
      uVar1 = (pNVar3->out).table_.ptr_[uVar7];
      unaff_RBP = (ulong)uVar1;
      uVar8 = uVar7 + 1;
    } while ((int)uVar1 < 0);
    if (uVar6 <= uVar7) break;
    uVar11 = (pRVar2->nodes_).ptr_[unaff_RBP]->rank;
    uVar12 = unaff_RBP;
    if ((int)uVar11 <= pNVar3->rank) {
      raw_log_internal::RawLog
                (kFatal,"graphcycles.cc",0x19e,"Edge %u ->%d has bad rank assignment %d->%d",
                 uVar9 & 0xffffffff,unaff_RBP,(ulong)(uint)pNVar3->rank,(ulong)uVar11);
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/synchronization/internal/graphcycles.cc"
                    ,0x19e,
                    "bool absl::synchronization_internal::GraphCycles::CheckInvariants() const");
    }
  } while( true );
  uVar9 = uVar9 + 1;
  if ((pRVar2->nodes_).size_ <= uVar9) goto LAB_00394b8a;
  goto LAB_00394a87;
}

Assistant:

bool GraphCycles::CheckInvariants() const {
  Rep* r = rep_;
  NodeSet ranks;  // Set of ranks seen so far.
  for (uint32_t x = 0; x < r->nodes_.size(); x++) {
    Node* nx = r->nodes_[x];
    void* ptr = base_internal::UnhidePtr<void>(nx->masked_ptr);
    if (ptr != nullptr && static_cast<uint32_t>(r->ptrmap_.Find(ptr)) != x) {
      ABSL_RAW_LOG(FATAL, "Did not find live node in hash table %" PRIu32 " %p",
                   x, ptr);
    }
    if (nx->visited) {
      ABSL_RAW_LOG(FATAL, "Did not clear visited marker on node %" PRIu32, x);
    }
    if (!ranks.insert(nx->rank)) {
      ABSL_RAW_LOG(FATAL, "Duplicate occurrence of rank %" PRId32, nx->rank);
    }
    HASH_FOR_EACH(y, nx->out) {
      Node* ny = r->nodes_[static_cast<uint32_t>(y)];
      if (nx->rank >= ny->rank) {
        ABSL_RAW_LOG(FATAL,
                     "Edge %" PRIu32 " ->%" PRId32
                     " has bad rank assignment %" PRId32 "->%" PRId32,
                     x, y, nx->rank, ny->rank);
      }
    }
  }
  return true;
}